

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::Reset(S2Builder *this)

{
  pointer pVVar1;
  pointer ppVar2;
  pointer pGVar3;
  pointer piVar4;
  
  pVVar1 = (this->input_vertices_).
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  ppVar2 = (this->input_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->input_edges_).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar2) {
    (this->input_edges_).
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar2;
  }
  std::
  vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
  ::clear(&this->layers_);
  pGVar3 = (this->layer_options_).
           super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->layer_options_).
      super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar3) {
    (this->layer_options_).
    super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar3;
  }
  piVar4 = (this->layer_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->layer_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->layer_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  std::
  vector<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>,_std::allocator<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>_>_>
  ::clear(&this->layer_is_full_polygon_predicates_);
  piVar4 = (this->label_set_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->label_set_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->label_set_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  IdSetLexicon::Clear(&this->label_set_lexicon_);
  piVar4 = (this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar4;
  }
  this->label_set_modified_ = false;
  pVVar1 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::clear(&this->edge_sites_);
  this->snapping_needed_ = false;
  return;
}

Assistant:

void S2Builder::Reset() {
  input_vertices_.clear();
  input_edges_.clear();
  layers_.clear();
  layer_options_.clear();
  layer_begins_.clear();
  layer_is_full_polygon_predicates_.clear();
  label_set_ids_.clear();
  label_set_lexicon_.Clear();
  label_set_.clear();
  label_set_modified_ = false;
  sites_.clear();
  edge_sites_.clear();
  snapping_needed_ = false;
}